

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionEntryPointInfo::FunctionEntryPointInfo
          (FunctionEntryPointInfo *this,FunctionProxy *functionProxy,JavascriptMethod method,
          ThreadContext *context)

{
  EntryPointInfo::EntryPointInfo
            (&this->super_EntryPointInfo,method,
             (functionProxy->m_scriptContext->super_ScriptContextBase).javascriptLibrary,context,
             false);
  (this->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014efa98;
  Memory::Recycler::WBSetBit((char *)&this->functionProxy);
  (this->functionProxy).ptr = functionProxy;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->functionProxy);
  (this->nextEntryPoint).ptr = (FunctionEntryPointInfo *)0x0;
  this->localVarSlotsOffset = -1;
  this->localVarChangedOffset = -1;
  this->callsCount = 0;
  this->jitMode = Interpreter;
  return;
}

Assistant:

FunctionEntryPointInfo::FunctionEntryPointInfo(FunctionProxy * functionProxy, Js::JavascriptMethod method, ThreadContext* context) :
        EntryPointInfo(method, functionProxy->GetScriptContext()->GetLibrary(), context),
        localVarSlotsOffset(Js::Constants::InvalidOffset),
        localVarChangedOffset(Js::Constants::InvalidOffset),
        callsCount(0),
        jitMode(ExecutionMode::Interpreter),
        functionProxy(functionProxy),
        nextEntryPoint(nullptr)
    {
    }